

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTriggerFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  sqlite3 *db_00;
  char *z;
  bool bVar4;
  sqlite3 *db;
  char *zRet;
  uchar *puStack_58;
  int len;
  uchar *zCsr;
  int dist;
  Token tname;
  int token;
  uchar *zTableName;
  uchar *zSql;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  puVar2 = sqlite3_value_text(*argv);
  puVar3 = sqlite3_value_text(argv[1]);
  zCsr._4_4_ = 3;
  zRet._4_4_ = 0;
  db_00 = sqlite3_context_db_handle(context);
  puStack_58 = puVar2;
  if (puVar2 != (uchar *)0x0) {
    do {
      puVar1 = puStack_58;
      if (*puStack_58 == '\0') {
        return;
      }
      tname.z._0_4_ = zRet._4_4_;
      do {
        puStack_58 = puStack_58 + (int)zRet._4_4_;
        zRet._4_4_ = sqlite3GetToken(puStack_58,(int *)&tname.field_0xc);
      } while (tname._12_4_ == 0x95);
      zCsr._4_4_ = zCsr._4_4_ + 1;
      if ((tname._12_4_ == 0x76) || (tname._12_4_ == 0x68)) {
        zCsr._4_4_ = 0;
      }
      bVar4 = true;
      if (((zCsr._4_4_ == 2) && (bVar4 = false, tname._12_4_ != 0x87)) &&
         (bVar4 = false, tname._12_4_ != 0x2d)) {
        bVar4 = tname._12_4_ != 5;
      }
    } while (bVar4);
    z = sqlite3MPrintf(db_00,"%.*s\"%w\"%s",(long)puVar1 - (long)puVar2,puVar2,puVar3,
                       puVar1 + (uint)tname.z);
    sqlite3_result_text(context,z,-1,sqlite3MallocSize);
  }
  return;
}

Assistant:

static void renameTriggerFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  unsigned char const *zSql = sqlite3_value_text(argv[0]);
  unsigned char const *zTableName = sqlite3_value_text(argv[1]);

  int token;
  Token tname;
  int dist = 3;
  unsigned char const *zCsr = zSql;
  int len = 0;
  char *zRet;
  sqlite3 *db = sqlite3_context_db_handle(context);

  UNUSED_PARAMETER(NotUsed);

  /* The principle used to locate the table name in the CREATE TRIGGER 
  ** statement is that the table name is the first token that is immediatedly
  ** preceded by either TK_ON or TK_DOT and immediatedly followed by one
  ** of TK_WHEN, TK_BEGIN or TK_FOR.
  */
  if( zSql ){
    do {

      if( !*zCsr ){
        /* Ran out of input before finding the table name. Return NULL. */
        return;
      }

      /* Store the token that zCsr points to in tname. */
      tname.z = (char*)zCsr;
      tname.n = len;

      /* Advance zCsr to the next token. Store that token type in 'token',
      ** and its length in 'len' (to be used next iteration of this loop).
      */
      do {
        zCsr += len;
        len = sqlite3GetToken(zCsr, &token);
      }while( token==TK_SPACE );
      assert( len>0 );

      /* Variable 'dist' stores the number of tokens read since the most
      ** recent TK_DOT or TK_ON. This means that when a WHEN, FOR or BEGIN 
      ** token is read and 'dist' equals 2, the condition stated above
      ** to be met.
      **
      ** Note that ON cannot be a database, table or column name, so
      ** there is no need to worry about syntax like 
      ** "CREATE TRIGGER ... ON ON.ON BEGIN ..." etc.
      */
      dist++;
      if( token==TK_DOT || token==TK_ON ){
        dist = 0;
      }
    } while( dist!=2 || (token!=TK_WHEN && token!=TK_FOR && token!=TK_BEGIN) );

    /* Variable tname now contains the token that is the old table-name
    ** in the CREATE TRIGGER statement.
    */
    zRet = sqlite3MPrintf(db, "%.*s\"%w\"%s", ((u8*)tname.z) - zSql, zSql, 
       zTableName, tname.z+tname.n);
    sqlite3_result_text(context, zRet, -1, SQLITE_DYNAMIC);
  }
}